

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::escape_file_path_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,file_storage *storage,file_index_t index)

{
  string *save_path;
  undefined1 auVar1 [16];
  string_view str;
  allocator<char> local_69;
  string local_68;
  file_index_t local_44;
  undefined1 local_40 [8];
  string new_path;
  file_storage *storage_local;
  file_index_t index_local;
  
  local_44.m_val = (int)storage;
  new_path.field_2._8_8_ = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  save_path = &local_68;
  file_storage::file_path((string *)local_40,(file_storage *)this,local_44,save_path);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  auVar1 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  str._M_len = auVar1._8_8_;
  str._M_str = (char *)save_path;
  escape_path_abi_cxx11_(__return_storage_ptr__,auVar1._0_8_,str);
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string escape_file_path(file_storage const& storage, file_index_t index)
{
	std::string new_path { storage.file_path(index) };
#ifdef TORRENT_WINDOWS
	convert_path_to_posix(new_path);
#endif
	return escape_path(new_path);
}